

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitRefCast(PrintExpressionContents *this,RefCast *curr)

{
  ostream *stream;
  
  stream = this->o;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"ref.cast ",9);
  Colors::outputColorCode(stream,"\x1b[0m");
  PrintSExpression::printType
            (this->parent,
             (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression.type.
                   id);
  return;
}

Assistant:

void visitRefCast(RefCast* curr) {
    printMedium(o, "ref.cast ");
    printType(curr->type);
  }